

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O3

int anon_unknown.dwarf_26278::ChannelOut_aftertouch(lua_State *L)

{
  int iVar1;
  undefined8 in_RAX;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  plVar2 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar3 = luaL_checkinteger(L,2);
  if (0x7f < uVar3) {
    luaL_argerror(L,2,"Aftertouch pressure must be between 0 and 127");
  }
  iVar1 = lua_type(L,3);
  uVar6 = uStack_28;
  if (iVar1 < 1) {
    lVar7 = (long)&uStack_28 + 3;
    uStack_28._5_3_ = SUB83(uVar6,5);
    uStack_28._0_5_ = CONCAT14((char)uVar3,CONCAT13((char)plVar2[1] + -0x30,(undefined3)uStack_28));
    plVar2 = *(long **)(*plVar2 + 8);
    lVar5 = *plVar2;
    uVar6 = 2;
  }
  else {
    uVar4 = luaL_checkinteger(L,3);
    if (0x7f < uVar4) {
      luaL_argerror(L,3,"Pitch must be between 0 and 127");
    }
    lVar7 = (long)&uStack_28 + 5;
    uStack_28 = CONCAT17((char)uVar3,
                         CONCAT16((char)uVar4,
                                  CONCAT15((char)plVar2[1] + -0x60,(undefined5)uStack_28)));
    plVar2 = *(long **)(*plVar2 + 8);
    lVar5 = *plVar2;
    uVar6 = 3;
  }
  (**(code **)(lVar5 + 0x58))(plVar2,lVar7,uVar6);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_aftertouch(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer pressure = luaL_checkinteger(L, 2);

	luaL_argcheck(L, pressure >= 0 && pressure <= 0x7F, 2, "Aftertouch pressure must be between 0 and 127");

	if (!lua_isnoneornil(L, 3)) {
		lua_Integer pitch = luaL_checkinteger(L, 3);
		luaL_argcheck(L, pitch >= 0 && pitch <= 0x7F, 3, "Pitch must be between 0 and 127");
		self.send(0xA0 + self.index, pitch, pressure);
	}
	else
		self.send(0xD0 + self.index, pressure);

	lua_settop(L, 1);
	return 1;
}